

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::writePMT(TSMuxer *this)

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  uint8_t *__src;
  long lVar4;
  
  if (0 < this->m_pmtFrames) {
    __src = this->m_pmtBuffer;
    lVar4 = 0;
    do {
      iVar3 = this->m_outBufLen;
      if (this->m_m2tsMode == true) {
        iVar3 = iVar3 + 4;
        this->m_outBufLen = iVar3;
        this->m_processedBlockSize = this->m_processedBlockSize + 4;
        this->m_pcrBits = this->m_pcrBits + 0x20;
      }
      memcpy(this->m_outBuf + iVar3,__src,0xbc);
      uVar2 = this->m_pmtCnt;
      this->m_pmtCnt = uVar2 + 1;
      *(uint *)(this->m_outBuf + this->m_outBufLen) =
           *(uint *)(this->m_outBuf + this->m_outBufLen) & 0xf0ffffff | (uVar2 & 0xf) << 0x18;
      this->m_outBufLen = this->m_outBufLen + 0xbc;
      this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
      this->m_pcrBits = this->m_pcrBits + 0x5e0;
      puVar1 = (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      *puVar1 = *puVar1 + 1;
      writeOutBuffer(this);
      __src = __src + 0xbc;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->m_pmtFrames);
  }
  return;
}

Assistant:

void TSMuxer::writePMT()
{
    const uint8_t* curPos = m_pmtBuffer;
    for (int i = 0; i < m_pmtFrames; i++)
    {
        if (m_m2tsMode)
        {
            m_outBufLen += 4;
            m_processedBlockSize += 4;
            m_pcrBits += 4 * 8;
        }
        memcpy(m_outBuf + m_outBufLen, curPos, TS_FRAME_SIZE);
        const auto tsPacket = reinterpret_cast<TSPacket*>(m_outBuf + m_outBufLen);
        tsPacket->counter = m_pmtCnt++;
        m_outBufLen += TS_FRAME_SIZE;
        m_processedBlockSize += TS_FRAME_SIZE;
        m_pcrBits += TS_FRAME_SIZE * 8;
        m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
        writeOutBuffer();
        curPos += TS_FRAME_SIZE;
    }
}